

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void ptls_set_context(ptls_t *tls,ptls_context_t *ctx)

{
  st_ptls_update_open_count_t *psVar1;
  
  psVar1 = ctx->update_open_count;
  if (psVar1 != (st_ptls_update_open_count_t *)0x0) {
    (*psVar1->cb)(psVar1,1);
  }
  psVar1 = tls->ctx->update_open_count;
  if (psVar1 != (st_ptls_update_open_count_t *)0x0) {
    (*psVar1->cb)(psVar1,-1);
  }
  tls->ctx = ctx;
  return;
}

Assistant:

void ptls_set_context(ptls_t *tls, ptls_context_t *ctx)
{
    update_open_count(ctx, 1);
    update_open_count(tls->ctx, -1);
    tls->ctx = ctx;
}